

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-blows.c
# Opt level: O1

char * monster_blow_method_action(blow_method *method,wchar_t midx)

{
  blow_message *pbVar1;
  uint32_t uVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  ushort **ppuVar6;
  char *pcVar7;
  byte bVar8;
  byte *pbVar9;
  size_t end;
  char punct [8];
  char m_name [80];
  char buf [1024];
  size_t local_498 [12];
  char local_438 [1032];
  
  local_498[1] = 0x272c3a3b3f212e;
  memset(local_438,0,0x400);
  local_498[0] = 0;
  uVar2 = Rand_div(method->num_messages);
  pbVar1 = method->messages;
  if (L'\0' < midx) {
    cave_monster(cave,midx);
  }
  for (; uVar2 != 0; uVar2 = uVar2 - 1) {
    pbVar1 = pbVar1->next;
  }
  pcVar7 = pbVar1->act_msg;
  pcVar5 = strchr(pcVar7,0x7b);
  if (pcVar5 != (char *)0x0) {
    do {
      strnfcat(local_438,0x400,local_498,"%.*s",(ulong)(uint)((int)pcVar5 - (int)pcVar7),pcVar7);
      pcVar7 = pcVar5 + 1;
      bVar8 = pcVar5[1];
      if (bVar8 != 0) {
        ppuVar6 = __ctype_b_loc();
        pbVar9 = (byte *)(pcVar5 + 2);
        do {
          if ((*(byte *)((long)*ppuVar6 + (ulong)bVar8 * 2 + 1) & 4) == 0) {
            if (bVar8 == 0x7d) {
              iVar3 = strncmp(pcVar7,"target",6);
              if (iVar3 == 0) {
                uVar4 = 1;
              }
              else {
                iVar3 = strncmp(pcVar7,"oftarget",8);
                if (iVar3 == 0) {
                  uVar4 = 2;
                }
                else {
                  iVar3 = strncmp(pcVar7,"has",3);
                  uVar4 = (uint)(iVar3 == 0) * 3;
                }
              }
              pcVar7 = (char *)(*(code *)(&DAT_00267894 + *(int *)(&DAT_00267894 + (ulong)uVar4 * 4)
                                         ))();
              return pcVar7;
            }
            break;
          }
          bVar8 = *pbVar9;
          pbVar9 = pbVar9 + 1;
        } while (bVar8 != 0);
      }
      pcVar5 = strchr(pcVar7,0x7b);
    } while (pcVar5 != (char *)0x0);
  }
  strnfcat(local_438,0x400,local_498,"%s",pcVar7);
  pcVar7 = string_make(local_438);
  return pcVar7;
}

Assistant:

char *monster_blow_method_action(const struct blow_method *method, int midx)
{
	const char punct[] = ".!?;:,'";
	char buf[1024] = "\0";
	const char *next;
	const char *s;
	const char *tag;
	const char *in_cursor;
	size_t end = 0;
	struct monster *t_mon = NULL;

	int choice = randint0(method->num_messages);
	const struct blow_message *msg = method->messages;

	/* Get the target monster, if any */
	if (midx > 0) {
		t_mon = cave_monster(cave, midx);
	}

	/* Pick a message */
	while (choice--) {
		msg = msg->next;
	}
	in_cursor = msg->act_msg;

	/* Add info to the message */
	next = strchr(in_cursor, '{');
	while (next) {
		/* Copy the text leading up to this { */
		strnfcat(buf, 1024, &end, "%.*s", (int) (next - in_cursor),
			in_cursor);

		s = next + 1;
		while (*s && isalpha((unsigned char) *s)) s++;

		/* Valid tag */
		if (*s == '}') {
			/* Start the tag after the { */
			tag = next + 1;
			in_cursor = s + 1;

			switch (blow_tag_lookup(tag)) {
				case BLOW_TAG_TARGET: {
					char m_name[80];
					if (midx > 0) {
						int mdesc_mode = MDESC_TARG;

						if (!strchr(punct, *in_cursor)) {
							mdesc_mode |= MDESC_COMMA;
						}
						monster_desc(m_name,
							sizeof(m_name), t_mon,
							mdesc_mode);
						strnfcat(buf, sizeof(buf),
							&end, "%s", m_name);
					} else {
						strnfcat(buf, sizeof(buf), &end, "you");
					}
					break;
				}
				case BLOW_TAG_OF_TARGET: {
					char m_name[80];
					if (midx > 0) {
						monster_desc(m_name,
							sizeof(m_name), t_mon,
							MDESC_TARG | MDESC_POSS);
						strnfcat(buf, sizeof(buf), &end, "%s", m_name);
					} else {
						strnfcat(buf, sizeof(buf), &end, "your");
					}
					break;
				}
				case BLOW_TAG_HAS: {
					if (midx > 0) {
						strnfcat(buf, sizeof(buf), &end, "has");
					} else {
						strnfcat(buf, sizeof(buf), &end, "have");
					}
					break;
				}

				default: {
					break;
				}
			}
		} else {
			/* An invalid tag, skip it */
			in_cursor = next + 1;
		}

		next = strchr(in_cursor, '{');
	}
	strnfcat(buf, 1024, &end, "%s", in_cursor);
	return string_make(buf);
}